

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O0

void PredictorAdd0_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  long in_RCX;
  int in_EDX;
  long in_RDI;
  __m128i res;
  __m128i src;
  __m128i black;
  int i;
  int local_9c;
  char cStack_35;
  undefined1 uStack_34;
  undefined1 uStack_33;
  undefined1 uStack_32;
  char cStack_31;
  char cStack_2d;
  undefined1 uStack_2c;
  undefined1 uStack_2b;
  undefined1 uStack_2a;
  char cStack_29;
  
  for (local_9c = 0; local_9c + 4 <= in_EDX; local_9c = local_9c + 4) {
    puVar3 = (undefined8 *)(in_RDI + (long)local_9c * 4);
    uVar1 = *puVar3;
    uVar2 = puVar3[1];
    cStack_35 = (char)((ulong)uVar1 >> 0x18);
    uStack_34 = (undefined1)((ulong)uVar1 >> 0x20);
    uStack_33 = (undefined1)((ulong)uVar1 >> 0x28);
    uStack_32 = (undefined1)((ulong)uVar1 >> 0x30);
    cStack_31 = (char)((ulong)uVar1 >> 0x38);
    cStack_2d = (char)((ulong)uVar2 >> 0x18);
    uStack_2c = (undefined1)((ulong)uVar2 >> 0x20);
    uStack_2b = (undefined1)((ulong)uVar2 >> 0x28);
    uStack_2a = (undefined1)((ulong)uVar2 >> 0x30);
    cStack_29 = (char)((ulong)uVar2 >> 0x38);
    puVar3 = (undefined8 *)(in_RCX + (long)local_9c * 4);
    *puVar3 = CONCAT17(cStack_31 + -1,
                       CONCAT16(uStack_32,
                                CONCAT15(uStack_33,
                                         CONCAT14(uStack_34,CONCAT13(cStack_35 + -1,(int3)uVar1)))))
    ;
    puVar3[1] = CONCAT17(cStack_29 + -1,
                         CONCAT16(uStack_2a,
                                  CONCAT15(uStack_2b,
                                           CONCAT14(uStack_2c,CONCAT13(cStack_2d + -1,(int3)uVar2)))
                                 ));
  }
  if (local_9c != in_EDX) {
    (*VP8LPredictorsAdd_C[0])
              ((uint32_t *)(in_RDI + (long)local_9c * 4),(uint32_t *)0x0,in_EDX - local_9c,
               (uint32_t *)(in_RCX + (long)local_9c * 4));
  }
  return;
}

Assistant:

static void PredictorAdd0_SSE2(const uint32_t* in, const uint32_t* upper,
                               int num_pixels, uint32_t* WEBP_RESTRICT out) {
  int i;
  const __m128i black = _mm_set1_epi32((int)ARGB_BLACK);
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    const __m128i res = _mm_add_epi8(src, black);
    _mm_storeu_si128((__m128i*)&out[i], res);
  }
  if (i != num_pixels) {
    VP8LPredictorsAdd_C[0](in + i, NULL, num_pixels - i, out + i);
  }
  (void)upper;
}